

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void ClipperLib::InitEdge2(TEdge *e,PolyType Pt)

{
  TEdge *pTVar1;
  double dVar2;
  cInt cVar3;
  long lVar4;
  
  pTVar1 = e->Next;
  if ((e->Curr).Y < (pTVar1->Curr).Y) {
    cVar3 = (e->Curr).Y;
    (e->Top).X = (e->Curr).X;
    (e->Top).Y = cVar3;
    cVar3 = (pTVar1->Curr).Y;
    (e->Bot).X = (pTVar1->Curr).X;
    (e->Bot).Y = cVar3;
  }
  else {
    cVar3 = (e->Curr).Y;
    (e->Bot).X = (e->Curr).X;
    (e->Bot).Y = cVar3;
    cVar3 = (pTVar1->Curr).Y;
    (e->Top).X = (pTVar1->Curr).X;
    (e->Top).Y = cVar3;
  }
  lVar4 = (e->Top).Y - (e->Bot).Y;
  if (lVar4 == 0) {
    dVar2 = -1e+40;
  }
  else {
    dVar2 = (double)((e->Top).X - (e->Bot).X) / (double)lVar4;
  }
  e->Dx = dVar2;
  e->PolyTyp = Pt;
  return;
}

Assistant:

void InitEdge2(TEdge& e, PolyType Pt)
{
  if (e.Curr.Y >= e.Next->Curr.Y)
  {
    e.Bot = e.Curr;
    e.Top = e.Next->Curr;
  } else
  {
    e.Top = e.Curr;
    e.Bot = e.Next->Curr;
  }
  SetDx(e);
  e.PolyTyp = Pt;
}